

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddVarint
          (UnknownFieldLiteParserHelper *this,uint32 num,uint64 value)

{
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num << 3),this->unknown_);
    WriteVarint(value,this->unknown_);
    return;
  }
  return;
}

Assistant:

void AddVarint(uint32 num, uint64 value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8, unknown_);
    WriteVarint(value, unknown_);
  }